

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *ofs,vector<int,_std::allocator<int>_> *v)

{
  pointer piVar1;
  ulong uVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"[",1);
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(ofs,", ",2);
        piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_start;
      }
      std::ostream::operator<<(ofs,piVar1[uVar2]);
      uVar2 = uVar2 + 1;
      piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar2 < (ulong)((long)(v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar1 >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(ofs,"]",1);
  return ofs;
}

Assistant:

std::ostream &operator<<(std::ostream &ofs, const std::vector<int32_t> &v) {
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
  // numeric_limits<uint64_t>::digits10 is 19, so 32 should suffice.
  char buf[32];
#endif

  ofs << "[";
  for (size_t i = 0; i < v.size(); i++) {
    if (i > 0) {
      ofs << ", ";
    }
#if defined(TINYUSDZ_LOCAL_USE_JEAIII_ITOA)
    tinyusdz::itoa(v[i], buf);
    ofs << buf;
#else
    ofs << v[i];
#endif
  }
  ofs << "]";

  return ofs;
}